

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qeventpoint.cpp
# Opt level: O0

void QEventPoint::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  bool bVar2;
  State SVar3;
  int iVar4;
  QEventPoint *this;
  QPointingDeviceUniqueId QVar5;
  undefined8 *in_RCX;
  uint in_EDX;
  int in_ESI;
  QEventPoint *in_RDI;
  long in_FS_OFFSET;
  QEventPointPrivate *pQVar6;
  QVector2D QVar7;
  QSizeF QVar8;
  QPointF QVar9;
  void *_v_1;
  void *_v;
  QEventPoint *_t;
  QEventPoint *in_stack_fffffffffffffee8;
  QEventPoint *in_stack_fffffffffffffef0;
  QEventPointPrivate *local_e8;
  QEventPointPrivate *local_e0;
  QEventPointPrivate *local_d8;
  QEventPointPrivate *local_d0;
  QEventPointPrivate *local_c8;
  QEventPointPrivate *local_c0;
  QEventPointPrivate *local_b8;
  QEventPointPrivate *local_b0;
  QEventPointPrivate *local_a8;
  QEventPointPrivate *local_a0;
  QEventPointPrivate *local_98;
  QEventPointPrivate *local_90;
  QEventPointPrivate *local_88;
  QEventPointPrivate *local_80;
  QEventPointPrivate *local_78;
  QEventPointPrivate *local_70;
  QEventPointPrivate *local_68;
  QEventPointPrivate *local_60;
  QEventPointPrivate *local_58;
  QEventPointPrivate *local_50;
  QEventPointPrivate *local_48;
  QEventPointPrivate *local_40;
  QEventPointPrivate *local_38;
  QEventPointPrivate *local_30;
  QEventPointPrivate *local_28;
  QEventPointPrivate *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 1) {
    in_stack_fffffffffffffef0 = (QEventPoint *)*in_RCX;
    this = (QEventPoint *)(ulong)in_EDX;
    switch(this) {
    case (QEventPoint *)0x0:
      bVar2 = isAccepted(this);
      *(bool *)&(in_stack_fffffffffffffef0->d).d.ptr = bVar2;
      break;
    case (QEventPoint *)0x1:
      pQVar6 = (QEventPointPrivate *)device(this);
      (in_stack_fffffffffffffef0->d).d.ptr = pQVar6;
      break;
    case (QEventPoint *)0x2:
      iVar4 = id(this);
      *(int *)&(in_stack_fffffffffffffef0->d).d.ptr = iVar4;
      break;
    case (QEventPoint *)0x3:
      QVar5 = uniqueId(in_stack_fffffffffffffee8);
      (in_stack_fffffffffffffef0->d).d.ptr = (QEventPointPrivate *)QVar5.m_numericId;
      break;
    case (QEventPoint *)0x4:
      SVar3 = state(this);
      *(State *)&(in_stack_fffffffffffffef0->d).d.ptr = SVar3;
      break;
    case (QEventPoint *)0x5:
      pQVar6 = (QEventPointPrivate *)timestamp(this);
      (in_stack_fffffffffffffef0->d).d.ptr = pQVar6;
      break;
    case (QEventPoint *)0x6:
      pQVar6 = (QEventPointPrivate *)pressTimestamp(this);
      (in_stack_fffffffffffffef0->d).d.ptr = pQVar6;
      break;
    case (QEventPoint *)0x7:
      pQVar6 = (QEventPointPrivate *)lastTimestamp(this);
      (in_stack_fffffffffffffef0->d).d.ptr = pQVar6;
      break;
    case (QEventPoint *)0x8:
      pQVar6 = (QEventPointPrivate *)timeHeld(in_stack_fffffffffffffef0);
      (in_stack_fffffffffffffef0->d).d.ptr = pQVar6;
      break;
    case (QEventPoint *)0x9:
      pQVar6 = (QEventPointPrivate *)pressure(this);
      (in_stack_fffffffffffffef0->d).d.ptr = pQVar6;
      break;
    case (QEventPoint *)0xa:
      pQVar6 = (QEventPointPrivate *)rotation(this);
      (in_stack_fffffffffffffef0->d).d.ptr = pQVar6;
      break;
    case (QEventPoint *)0xb:
      QVar8 = ellipseDiameters(in_stack_fffffffffffffee8);
      local_28 = (QEventPointPrivate *)QVar8.wd;
      (in_stack_fffffffffffffef0->d).d.ptr = local_28;
      local_20 = (QEventPointPrivate *)QVar8.ht;
      in_stack_fffffffffffffef0[1].d.d.ptr = local_20;
      break;
    case (QEventPoint *)0xc:
      QVar7 = velocity(in_stack_fffffffffffffef0);
      (in_stack_fffffffffffffef0->d).d.ptr = (QEventPointPrivate *)QVar7.v;
      break;
    case (QEventPoint *)0xd:
      QVar9 = position(in_stack_fffffffffffffee8);
      local_38 = (QEventPointPrivate *)QVar9.xp;
      (in_stack_fffffffffffffef0->d).d.ptr = local_38;
      local_30 = (QEventPointPrivate *)QVar9.yp;
      in_stack_fffffffffffffef0[1].d.d.ptr = local_30;
      break;
    case (QEventPoint *)0xe:
      QVar9 = pressPosition(in_RDI);
      local_48 = (QEventPointPrivate *)QVar9.xp;
      (in_stack_fffffffffffffef0->d).d.ptr = local_48;
      local_40 = (QEventPointPrivate *)QVar9.yp;
      in_stack_fffffffffffffef0[1].d.d.ptr = local_40;
      break;
    case (QEventPoint *)0xf:
      QVar9 = grabPosition(in_RDI);
      local_58 = (QEventPointPrivate *)QVar9.xp;
      (in_stack_fffffffffffffef0->d).d.ptr = local_58;
      local_50 = (QEventPointPrivate *)QVar9.yp;
      in_stack_fffffffffffffef0[1].d.d.ptr = local_50;
      break;
    case (QEventPoint *)0x10:
      QVar9 = lastPosition(in_RDI);
      local_68 = (QEventPointPrivate *)QVar9.xp;
      (in_stack_fffffffffffffef0->d).d.ptr = local_68;
      local_60 = (QEventPointPrivate *)QVar9.yp;
      in_stack_fffffffffffffef0[1].d.d.ptr = local_60;
      break;
    case (QEventPoint *)0x11:
      QVar9 = scenePosition(in_stack_fffffffffffffee8);
      local_78 = (QEventPointPrivate *)QVar9.xp;
      (in_stack_fffffffffffffef0->d).d.ptr = local_78;
      local_70 = (QEventPointPrivate *)QVar9.yp;
      in_stack_fffffffffffffef0[1].d.d.ptr = local_70;
      break;
    case (QEventPoint *)0x12:
      QVar9 = scenePressPosition(in_RDI);
      local_88 = (QEventPointPrivate *)QVar9.xp;
      (in_stack_fffffffffffffef0->d).d.ptr = local_88;
      local_80 = (QEventPointPrivate *)QVar9.yp;
      in_stack_fffffffffffffef0[1].d.d.ptr = local_80;
      break;
    case (QEventPoint *)0x13:
      QVar9 = sceneGrabPosition(in_RDI);
      local_98 = (QEventPointPrivate *)QVar9.xp;
      (in_stack_fffffffffffffef0->d).d.ptr = local_98;
      local_90 = (QEventPointPrivate *)QVar9.yp;
      in_stack_fffffffffffffef0[1].d.d.ptr = local_90;
      break;
    case (QEventPoint *)0x14:
      QVar9 = sceneLastPosition(in_RDI);
      local_a8 = (QEventPointPrivate *)QVar9.xp;
      (in_stack_fffffffffffffef0->d).d.ptr = local_a8;
      local_a0 = (QEventPointPrivate *)QVar9.yp;
      in_stack_fffffffffffffef0[1].d.d.ptr = local_a0;
      break;
    case (QEventPoint *)0x15:
      QVar9 = globalPosition(in_stack_fffffffffffffee8);
      local_b8 = (QEventPointPrivate *)QVar9.xp;
      (in_stack_fffffffffffffef0->d).d.ptr = local_b8;
      local_b0 = (QEventPointPrivate *)QVar9.yp;
      in_stack_fffffffffffffef0[1].d.d.ptr = local_b0;
      break;
    case (QEventPoint *)0x16:
      QVar9 = globalPressPosition(in_stack_fffffffffffffee8);
      local_c8 = (QEventPointPrivate *)QVar9.xp;
      (in_stack_fffffffffffffef0->d).d.ptr = local_c8;
      local_c0 = (QEventPointPrivate *)QVar9.yp;
      in_stack_fffffffffffffef0[1].d.d.ptr = local_c0;
      break;
    case (QEventPoint *)0x17:
      QVar9 = globalGrabPosition(in_stack_fffffffffffffee8);
      local_d8 = (QEventPointPrivate *)QVar9.xp;
      (in_stack_fffffffffffffef0->d).d.ptr = local_d8;
      local_d0 = (QEventPointPrivate *)QVar9.yp;
      in_stack_fffffffffffffef0[1].d.d.ptr = local_d0;
      break;
    case (QEventPoint *)0x18:
      QVar9 = globalLastPosition(in_stack_fffffffffffffee8);
      local_e8 = (QEventPointPrivate *)QVar9.xp;
      (in_stack_fffffffffffffef0->d).d.ptr = local_e8;
      local_e0 = (QEventPointPrivate *)QVar9.yp;
      in_stack_fffffffffffffef0[1].d.d.ptr = local_e0;
    }
  }
  if ((in_ESI == 2) && (in_EDX == 0)) {
    setAccepted(in_stack_fffffffffffffef0,SUB81((ulong)*in_RCX >> 0x38,0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEventPoint::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = reinterpret_cast<QEventPoint *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isAccepted(); break;
        case 1: *reinterpret_cast<const QPointingDevice**>(_v) = _t->device(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->id(); break;
        case 3: *reinterpret_cast<QPointingDeviceUniqueId*>(_v) = _t->uniqueId(); break;
        case 4: *reinterpret_cast<State*>(_v) = _t->state(); break;
        case 5: *reinterpret_cast<ulong*>(_v) = _t->timestamp(); break;
        case 6: *reinterpret_cast<ulong*>(_v) = _t->pressTimestamp(); break;
        case 7: *reinterpret_cast<ulong*>(_v) = _t->lastTimestamp(); break;
        case 8: *reinterpret_cast<qreal*>(_v) = _t->timeHeld(); break;
        case 9: *reinterpret_cast<qreal*>(_v) = _t->pressure(); break;
        case 10: *reinterpret_cast<qreal*>(_v) = _t->rotation(); break;
        case 11: *reinterpret_cast<QSizeF*>(_v) = _t->ellipseDiameters(); break;
        case 12: *reinterpret_cast<QVector2D*>(_v) = _t->velocity(); break;
        case 13: *reinterpret_cast<QPointF*>(_v) = _t->position(); break;
        case 14: *reinterpret_cast<QPointF*>(_v) = _t->pressPosition(); break;
        case 15: *reinterpret_cast<QPointF*>(_v) = _t->grabPosition(); break;
        case 16: *reinterpret_cast<QPointF*>(_v) = _t->lastPosition(); break;
        case 17: *reinterpret_cast<QPointF*>(_v) = _t->scenePosition(); break;
        case 18: *reinterpret_cast<QPointF*>(_v) = _t->scenePressPosition(); break;
        case 19: *reinterpret_cast<QPointF*>(_v) = _t->sceneGrabPosition(); break;
        case 20: *reinterpret_cast<QPointF*>(_v) = _t->sceneLastPosition(); break;
        case 21: *reinterpret_cast<QPointF*>(_v) = _t->globalPosition(); break;
        case 22: *reinterpret_cast<QPointF*>(_v) = _t->globalPressPosition(); break;
        case 23: *reinterpret_cast<QPointF*>(_v) = _t->globalGrabPosition(); break;
        case 24: *reinterpret_cast<QPointF*>(_v) = _t->globalLastPosition(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setAccepted(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}